

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Node * mainpositionTV(Table *t,TValue *key)

{
  GCObject *pGVar1;
  byte bVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  Node *pNVar5;
  double dVar6;
  int i;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  bVar2 = key->tt_ & 0x3f;
  switch(bVar2) {
  case 1:
    pNVar5 = t->node;
    break;
  case 2:
switchD_0011d023_caseD_12:
    uVar4 = (ulong)*(uint *)&key->value_ % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    goto LAB_0011d128;
  case 3:
    pGVar1 = (key->value_).gc;
    if (pGVar1 < (GCObject *)0x80000000) {
      uVar4 = ((ulong)pGVar1 & 0xffffffff) % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    }
    else {
      uVar4 = (ulong)pGVar1 % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    }
    pNVar5 = t->node + uVar4;
    break;
  case 4:
    uVar4 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc));
LAB_0011d128:
    uVar4 = uVar4 * 0x18;
LAB_0011d12c:
    pNVar5 = (Node *)(uVar4 + (long)t->node);
    break;
  default:
    switch(bVar2) {
    case 0x11:
      uVar4 = (ulong)((uint)(t->lsizenode != '\0') * 0x18);
      goto LAB_0011d12c;
    default:
      goto switchD_0011d023_caseD_12;
    case 0x13:
      pNVar5 = t->node;
      dVar6 = frexp((key->value_).n,&local_14);
      dVar6 = dVar6 * 2147483648.0;
      uVar3 = 0;
      if ((-9.223372036854776e+18 <= dVar6) && (uVar3 = 0, dVar6 < 9.223372036854776e+18)) {
        uVar3 = (int)(long)dVar6 + local_14;
        uVar3 = (int)uVar3 >> 0x1f ^ uVar3;
      }
      uVar4 = (ulong)uVar3 % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
      break;
    case 0x14:
      pNVar5 = t->node;
      uVar3 = luaS_hashlongstr((TString *)(key->value_).gc);
      uVar4 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & uVar3);
    }
    pNVar5 = pNVar5 + uVar4;
  }
  return pNVar5;
}

Assistant:

static Node *mainpositionTV (const Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VNUMINT: {
      lua_Integer i = ivalue(key);
      return hashint(t, i);
    }
    case LUA_VNUMFLT: {
      lua_Number n = fltvalue(key);
      return hashmod(t, l_hashfloat(n));
    }
    case LUA_VSHRSTR: {
      TString *ts = tsvalue(key);
      return hashstr(t, ts);
    }
    case LUA_VLNGSTR: {
      TString *ts = tsvalue(key);
      return hashpow2(t, luaS_hashlongstr(ts));
    }
    case LUA_VFALSE:
      return hashboolean(t, 0);
    case LUA_VTRUE:
      return hashboolean(t, 1);
    case LUA_VLIGHTUSERDATA: {
      void *p = pvalue(key);
      return hashpointer(t, p);
    }
    case LUA_VLCF: {
      lua_CFunction f = fvalue(key);
      return hashpointer(t, f);
    }
    default: {
      GCObject *o = gcvalue(key);
      return hashpointer(t, o);
    }
  }
}